

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  void **ppvVar1;
  byte bVar2;
  void *pvVar3;
  int iVar4;
  xmlHashTablePtr pxVar5;
  xmlEntityPtr pxVar6;
  uint uVar7;
  xmlDictPtr dict;
  bool bVar8;
  xmlChar ref_1 [4];
  xmlChar ref [4];
  uint local_38;
  undefined4 local_34;
  
  if (name == (xmlChar *)0x0) {
    return (xmlEntityPtr)0x0;
  }
  if (dtd->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = dtd->doc->dict;
  }
  if (type - 1U < 3) {
    pxVar6 = xmlGetPredefinedEntity(name);
    if (pxVar6 != (xmlEntityPtr)0x0) {
      if (content == (xmlChar *)0x0 || type != 1) goto LAB_001459fa;
      bVar2 = *pxVar6->content;
      if ((((*content != bVar2) || (content[1] != '\0')) || (0x3e < bVar2)) ||
         ((0x4000008400000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
        if ((*content != 0x26) || (content[1] != '#')) {
LAB_001459fa:
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(void *)0x0,2,0x68,XML_ERR_WARNING,(char *)0x0,0,(char *)name,
                          (char *)0x0,(char *)0x0,0,0,
                          "xmlAddEntity: invalid redeclaration of predefined entity \'%s\'",name,0);
          return (xmlEntityPtr)0x0;
        }
        if (content[2] == 'x') {
          local_34 = CONCAT22(0x3b,CONCAT11("0123456789ABCDEF"[bVar2 & 0xf],
                                            "0123456789ABCDEF"[bVar2 >> 4]));
          iVar4 = xmlStrcasecmp(content + 3,(xmlChar *)&local_34);
          bVar8 = iVar4 == 0;
        }
        else {
          uVar7 = bVar2 / 10;
          local_38 = CONCAT22(0x3b,CONCAT11(bVar2 + (bVar2 / 5 & 0xfe) * -5,
                                            (char)uVar7 + ((byte)(uVar7 / 5) & 6) * -5) | 0x30) |
                     0x3000;
          iVar4 = xmlStrEqual(content + 2,(xmlChar *)&local_38);
          bVar8 = iVar4 != 0;
        }
        if (!bVar8) goto LAB_001459fa;
      }
    }
    ppvVar1 = &dtd->entities;
    pvVar3 = dtd->entities;
  }
  else {
    if (1 < type - 4U) {
      pxVar5 = (xmlHashTablePtr)0x0;
      if (type == 6) {
        return (xmlEntityPtr)0x0;
      }
      goto LAB_0014590a;
    }
    ppvVar1 = &dtd->pentities;
    pvVar3 = dtd->pentities;
  }
  if (pvVar3 == (void *)0x0) {
    pxVar5 = xmlHashCreateDict(0,dict);
    *ppvVar1 = pxVar5;
  }
  pxVar5 = (xmlHashTablePtr)*ppvVar1;
LAB_0014590a:
  if ((pxVar5 != (xmlHashTablePtr)0x0) &&
     (pxVar6 = xmlCreateEntity(dict,name,type,ExternalID,SystemID,content),
     pxVar6 != (xmlEntityPtr)0x0)) {
    pxVar6->doc = dtd->doc;
    iVar4 = xmlHashAddEntry(pxVar5,name,pxVar6);
    if (iVar4 == 0) {
      return pxVar6;
    }
    xmlFreeEntity(pxVar6);
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

static xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content) {
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret, predef;

    if (name == NULL)
	return(NULL);
    if (dtd == NULL)
	return(NULL);
    if (dtd->doc != NULL)
        dict = dtd->doc->dict;

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
            predef = xmlGetPredefinedEntity(name);
            if (predef != NULL) {
                int valid = 0;

                /* 4.6 Predefined Entities */
                if ((type == XML_INTERNAL_GENERAL_ENTITY) &&
                    (content != NULL)) {
                    int c = predef->content[0];

                    if (((content[0] == c) && (content[1] == 0)) &&
                        ((c == '>') || (c == '\'') || (c == '"'))) {
                        valid = 1;
                    } else if ((content[0] == '&') && (content[1] == '#')) {
                        if (content[2] == 'x') {
                            xmlChar *hex = BAD_CAST "0123456789ABCDEF";
                            xmlChar ref[] = "00;";

                            ref[0] = hex[c / 16 % 16];
                            ref[1] = hex[c % 16];
                            if (xmlStrcasecmp(&content[3], ref) == 0)
                                valid = 1;
                        } else {
                            xmlChar ref[] = "00;";

                            ref[0] = '0' + c / 10 % 10;
                            ref[1] = '0' + c % 10;
                            if (xmlStrEqual(&content[2], ref))
                                valid = 1;
                        }
                    }
                }
                if (!valid) {
                    xmlEntitiesWarn(XML_ERR_ENTITY_PROCESSING,
                            "xmlAddEntity: invalid redeclaration of predefined"
                            " entity '%s'", name);
                    return(NULL);
                }
            }
	    if (dtd->entities == NULL)
		dtd->entities = xmlHashCreateDict(0, dict);
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL)
		dtd->pentities = xmlHashCreateDict(0, dict);
	    table = dtd->pentities;
	    break;
        case XML_INTERNAL_PREDEFINED_ENTITY:
	    return(NULL);
    }
    if (table == NULL)
	return(NULL);
    ret = xmlCreateEntity(dict, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(NULL);
    ret->doc = dtd->doc;

    if (xmlHashAddEntry(table, name, ret)) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(NULL);
    }
    return(ret);
}